

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

c_float osqp_toc(OSQPTimer *t)

{
  long *in_RDI;
  timespec temp;
  long local_18;
  long local_10;
  
  clock_gettime(1,(timespec *)(in_RDI + 2));
  if (in_RDI[3] - in_RDI[1] < 0) {
    local_18 = (in_RDI[2] - *in_RDI) + -1;
    local_10 = (long)(((double)in_RDI[3] + 1000000000.0) - (double)in_RDI[1]);
  }
  else {
    local_18 = in_RDI[2] - *in_RDI;
    local_10 = in_RDI[3] - in_RDI[1];
  }
  return (double)local_18 + (double)local_10 / 1000000000.0;
}

Assistant:

c_float osqp_toc(OSQPTimer *t)
{
  struct timespec temp;

  clock_gettime(CLOCK_MONOTONIC, &t->toc);

  if ((t->toc.tv_nsec - t->tic.tv_nsec) < 0) {
    temp.tv_sec  = t->toc.tv_sec - t->tic.tv_sec - 1;
    temp.tv_nsec = 1e9 + t->toc.tv_nsec - t->tic.tv_nsec;
  } else {
    temp.tv_sec  = t->toc.tv_sec - t->tic.tv_sec;
    temp.tv_nsec = t->toc.tv_nsec - t->tic.tv_nsec;
  }
  return (c_float)temp.tv_sec + (c_float)temp.tv_nsec / 1e9;
}